

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O0

int skipToGenCode(char *dstName,FILE *out,FILE *templateFile)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *in_RDX;
  FILE *in_RSI;
  undefined8 in_RDI;
  uint headerWritten;
  
  bVar1 = false;
  do {
    pcVar3 = fgets(gTempBuf,16000,in_RDX);
    if (pcVar3 == (char *)0x0) {
LAB_00114b2b:
      if (!bVar1) {
        printf("Line with string %%%%%%GENCODE%%%%%% Missing in [%s]",in_RDI);
        return -1;
      }
      return 0;
    }
    iVar2 = strncmp(gTempBuf,"%%%GENCODE%%%",0xd);
    if (iVar2 == 0) {
      bVar1 = true;
      goto LAB_00114b2b;
    }
    if ((in_RSI != (FILE *)0x0) && (iVar2 = fputs(gTempBuf,in_RSI), iVar2 == -1)) {
      printf("Cannot write to [%s]\n",in_RDI);
      return -1;
    }
  } while( true );
}

Assistant:

static int skipToGenCode( const char *dstName, FILE *out, FILE *templateFile )
{
   unsigned int headerWritten = 0;

   while( fgets( gTempBuf, BUFFER_SIZE, templateFile ) )
   {
      if( strncmp( gTempBuf, "%%%GENCODE%%%", 13 ) == 0 )
      {
         headerWritten = 1;
         break;
      }
      if( out && (fputs( gTempBuf, out ) == EOF) )
      {
         printf( "Cannot write to [%s]\n", dstName );
         return -1;
      }
   }

   if( !headerWritten )
   {
      printf( "Line with string %%%%%%GENCODE%%%%%% Missing in [%s]", dstName );
      return -1;
   }

   return 0;
}